

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O1

void validation_block_tests::witness_commitment_index_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unit_test_log_t *puVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  witness_commitment_index t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670 [3];
  ios_base local_600 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  undefined1 local_4d8 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_678 = "";
  memset((ostringstream *)local_4d8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
  local_360[0]._M_string_length = 0;
  local_360[0].field_2._M_local_buf[0] = '\0';
  local_670[0]._M_dataplus._M_p._0_1_ = 0x22;
  local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,(char *)local_670,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4d8,"witness_commitment_index",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_360,local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_670[0]._M_dataplus._M_p._1_7_,local_670[0]._M_dataplus._M_p._0_1_) !=
      &local_670[0].field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_670[0]._M_dataplus._M_p._1_7_,local_670[0]._M_dataplus._M_p._0_1_
                            ),local_670[0].field_2._M_allocated_capacity + 1);
  }
  local_690 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360[0]._M_dataplus._M_p;
  local_688 = local_360[0]._M_dataplus._M_p + local_360[0]._M_string_length;
  file.m_end = (iterator)0x148;
  file.m_begin = (iterator)&local_680;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_690,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
    operator_delete(local_360[0]._M_dataplus._M_p,
                    CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                             local_360[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
  std::ios_base::~ios_base((ios_base *)(local_4d8 + 0x70));
  RegTestingSetup::RegTestingSetup((RegTestingSetup *)local_4d8);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_698 = "";
  memset(local_670,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
  paVar1 = &local_4f8.field_2;
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_670,"witness_commitment_index",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4f8,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p;
  local_6a8 = local_4f8._M_dataplus._M_p + local_4f8._M_string_length;
  file_00.m_end = (iterator)0x148;
  file_00.m_begin = (iterator)&local_6a0;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_6b0,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
  std::ios_base::~ios_base(local_600);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_6b8 = "";
  memset(local_670,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_670,"witness_commitment_index",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4f8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p;
  local_6c8 = local_4f8._M_dataplus._M_p + local_4f8._M_string_length;
  file_01.m_end = (iterator)0x148;
  file_01.m_begin = (iterator)&local_6c0;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_6d0,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
  std::ios_base::~ios_base(local_600);
  witness_commitment_index::test_method((witness_commitment_index *)local_4d8);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_6d8 = "";
  memset(local_670,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_670,"witness_commitment_index",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_670,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4f8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p;
  local_6e8 = local_4f8._M_dataplus._M_p + local_4f8._M_string_length;
  file_02.m_end = (iterator)0x148;
  file_02.m_begin = (iterator)&local_6e0;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_6f0,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
  std::ios_base::~ios_base(local_600);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_6f8 = "";
  memset(local_670,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_670,"witness_commitment_index",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4f8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_710 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p;
  local_708 = local_4f8._M_dataplus._M_p + local_4f8._M_string_length;
  file_03.m_end = (iterator)0x148;
  file_03.m_begin = (iterator)&local_700;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_03,(size_t)&local_710,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
  std::ios_base::~ios_base(local_600);
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)local_4d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(witness_commitment_index)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    CScript pubKey;
    pubKey << 1 << OP_TRUE;
    BlockAssembler::Options options;
    auto ptemplate = BlockAssembler{m_node.chainman->ActiveChainstate(), m_node.mempool.get(), options}.CreateNewBlock(pubKey);
    CBlock pblock = ptemplate->block;

    CTxOut witness;
    witness.scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT);
    witness.scriptPubKey[0] = OP_RETURN;
    witness.scriptPubKey[1] = 0x24;
    witness.scriptPubKey[2] = 0xaa;
    witness.scriptPubKey[3] = 0x21;
    witness.scriptPubKey[4] = 0xa9;
    witness.scriptPubKey[5] = 0xed;

    // A witness larger than the minimum size is still valid
    CTxOut min_plus_one = witness;
    min_plus_one.scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT + 1);

    CTxOut invalid = witness;
    invalid.scriptPubKey[0] = OP_VERIFY;

    CMutableTransaction txCoinbase(*pblock.vtx[0]);
    txCoinbase.vout.resize(4);
    txCoinbase.vout[0] = witness;
    txCoinbase.vout[1] = witness;
    txCoinbase.vout[2] = min_plus_one;
    txCoinbase.vout[3] = invalid;
    pblock.vtx[0] = MakeTransactionRef(std::move(txCoinbase));

    BOOST_CHECK_EQUAL(GetWitnessCommitmentIndex(pblock), 2);
}